

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_aes_self_test(int verbose)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uchar (*pauVar4) [16];
  uchar (*pauVar5) [48];
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uchar *__s2;
  uint uVar10;
  uint uVar11;
  size_t __n;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uchar iv [16];
  uchar buf [64];
  uchar prv [16];
  uchar key [32];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  uchar tmp [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  uchar local_1f8 [56];
  size_t local_1c0;
  undefined1 local_1b8 [16];
  uchar local_1a8 [16];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  uchar local_178 [16];
  mbedtls_aes_context local_168;
  
  local_1a8[0] = '\0';
  local_1a8[1] = '\0';
  local_1a8[2] = '\0';
  local_1a8[3] = '\0';
  local_1a8[4] = '\0';
  local_1a8[5] = '\0';
  local_1a8[6] = '\0';
  local_1a8[7] = '\0';
  local_1a8[8] = '\0';
  local_1a8[9] = '\0';
  local_1a8[10] = '\0';
  local_1a8[0xb] = '\0';
  local_1a8[0xc] = '\0';
  local_1a8[0xd] = '\0';
  local_1a8[0xe] = '\0';
  local_1a8[0xf] = '\0';
  local_198 = (undefined1  [16])0x0;
  memset(&local_168,0,0x120);
  uVar9 = 0;
  do {
    while( true ) {
      uVar10 = uVar9 >> 1;
      if (verbose != 0) {
        pcVar6 = "enc";
        if ((uVar9 & 1) == 0) {
          pcVar6 = "dec";
        }
        printf("  AES-ECB-%3d (%s): ",(ulong)(uVar10 * 0x40 + 0x80),pcVar6);
      }
      local_208 = (undefined1  [16])0x0;
      uVar11 = uVar10 * 0x40 + 0x80;
      if ((uVar9 & 1) == 0) {
        mbedtls_aes_setkey_dec(&local_168,local_1a8,uVar11);
        iVar7 = 10000;
        do {
          mbedtls_aes_crypt_ecb(&local_168,0,local_208,local_208);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        pauVar4 = aes_test_ecb_dec;
      }
      else {
        mbedtls_aes_setkey_enc(&local_168,local_1a8,uVar11);
        iVar7 = 10000;
        do {
          mbedtls_aes_crypt_ecb(&local_168,1,local_208,local_208);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        pauVar4 = aes_test_ecb_enc;
      }
      pauVar4 = pauVar4 + uVar10;
      auVar13[0] = -((*pauVar4)[0] == local_208[0]);
      auVar13[1] = -((*pauVar4)[1] == local_208[1]);
      auVar13[2] = -((*pauVar4)[2] == local_208[2]);
      auVar13[3] = -((*pauVar4)[3] == local_208[3]);
      auVar13[4] = -((*pauVar4)[4] == local_208[4]);
      auVar13[5] = -((*pauVar4)[5] == local_208[5]);
      auVar13[6] = -((*pauVar4)[6] == local_208[6]);
      auVar13[7] = -((*pauVar4)[7] == local_208[7]);
      auVar13[8] = -((*pauVar4)[8] == local_208[8]);
      auVar13[9] = -((*pauVar4)[9] == local_208[9]);
      auVar13[10] = -((*pauVar4)[10] == local_208[10]);
      auVar13[0xb] = -((*pauVar4)[0xb] == local_208[0xb]);
      auVar13[0xc] = -((*pauVar4)[0xc] == local_208[0xc]);
      auVar13[0xd] = -((*pauVar4)[0xd] == local_208[0xd]);
      auVar13[0xe] = -((*pauVar4)[0xe] == local_208[0xe]);
      auVar13[0xf] = -((*pauVar4)[0xf] == local_208[0xf]);
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015246a;
      if (verbose == 0) break;
      puts("passed");
      uVar9 = uVar9 + 1;
      if (uVar9 == 6) {
        putchar(10);
        goto LAB_00151fa3;
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
LAB_00151fa3:
  uVar9 = 0;
  do {
    while( true ) {
      uVar10 = uVar9 >> 1;
      if (verbose != 0) {
        pcVar6 = "enc";
        if ((uVar9 & 1) == 0) {
          pcVar6 = "dec";
        }
        printf("  AES-CBC-%3d (%s): ",(ulong)(uVar10 * 0x40 + 0x80),pcVar6);
      }
      local_218 = (undefined1  [16])0x0;
      local_1b8 = (undefined1  [16])0x0;
      local_208 = (undefined1  [16])0x0;
      uVar11 = uVar10 * 0x40 + 0x80;
      if ((uVar9 & 1) == 0) {
        mbedtls_aes_setkey_dec(&local_168,local_1a8,uVar11);
        iVar7 = 10000;
        do {
          mbedtls_aes_crypt_cbc(&local_168,0,0x10,local_218,local_208,local_208);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        auVar14[0] = -(aes_test_cbc_dec[uVar10][0] == local_208[0]);
        auVar14[1] = -(aes_test_cbc_dec[uVar10][1] == local_208[1]);
        auVar14[2] = -(aes_test_cbc_dec[uVar10][2] == local_208[2]);
        auVar14[3] = -(aes_test_cbc_dec[uVar10][3] == local_208[3]);
        auVar14[4] = -(aes_test_cbc_dec[uVar10][4] == local_208[4]);
        auVar14[5] = -(aes_test_cbc_dec[uVar10][5] == local_208[5]);
        auVar14[6] = -(aes_test_cbc_dec[uVar10][6] == local_208[6]);
        auVar14[7] = -(aes_test_cbc_dec[uVar10][7] == local_208[7]);
        auVar14[8] = -(aes_test_cbc_dec[uVar10][8] == local_208[8]);
        auVar14[9] = -(aes_test_cbc_dec[uVar10][9] == local_208[9]);
        auVar14[10] = -(aes_test_cbc_dec[uVar10][10] == local_208[10]);
        auVar14[0xb] = -(aes_test_cbc_dec[uVar10][0xb] == local_208[0xb]);
        auVar14[0xc] = -(aes_test_cbc_dec[uVar10][0xc] == local_208[0xc]);
        auVar14[0xd] = -(aes_test_cbc_dec[uVar10][0xd] == local_208[0xd]);
        auVar14[0xe] = -(aes_test_cbc_dec[uVar10][0xe] == local_208[0xe]);
        auVar14[0xf] = -(aes_test_cbc_dec[uVar10][0xf] == local_208[0xf]);
      }
      else {
        mbedtls_aes_setkey_enc(&local_168,local_1a8,uVar11);
        iVar7 = 10000;
        do {
          mbedtls_aes_crypt_cbc(&local_168,1,0x10,local_218,local_208,local_208);
          auVar14 = local_1b8;
          auVar13 = local_208;
          local_1b8 = local_208;
          local_208 = auVar14;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        local_1b8[0] = auVar13[0];
        local_1b8[1] = auVar13[1];
        local_1b8[2] = auVar13[2];
        local_1b8[3] = auVar13[3];
        local_1b8[4] = auVar13[4];
        local_1b8[5] = auVar13[5];
        local_1b8[6] = auVar13[6];
        local_1b8[7] = auVar13[7];
        local_1b8[8] = auVar13[8];
        local_1b8[9] = auVar13[9];
        local_1b8[10] = auVar13[10];
        local_1b8[0xb] = auVar13[0xb];
        local_1b8[0xc] = auVar13[0xc];
        local_1b8[0xd] = auVar13[0xd];
        local_1b8[0xe] = auVar13[0xe];
        local_1b8[0xf] = auVar13[0xf];
        auVar14[0] = -(aes_test_cbc_enc[uVar10][0] == local_1b8[0]);
        auVar14[1] = -(aes_test_cbc_enc[uVar10][1] == local_1b8[1]);
        auVar14[2] = -(aes_test_cbc_enc[uVar10][2] == local_1b8[2]);
        auVar14[3] = -(aes_test_cbc_enc[uVar10][3] == local_1b8[3]);
        auVar14[4] = -(aes_test_cbc_enc[uVar10][4] == local_1b8[4]);
        auVar14[5] = -(aes_test_cbc_enc[uVar10][5] == local_1b8[5]);
        auVar14[6] = -(aes_test_cbc_enc[uVar10][6] == local_1b8[6]);
        auVar14[7] = -(aes_test_cbc_enc[uVar10][7] == local_1b8[7]);
        auVar14[8] = -(aes_test_cbc_enc[uVar10][8] == local_1b8[8]);
        auVar14[9] = -(aes_test_cbc_enc[uVar10][9] == local_1b8[9]);
        auVar14[10] = -(aes_test_cbc_enc[uVar10][10] == local_1b8[10]);
        auVar14[0xb] = -(aes_test_cbc_enc[uVar10][0xb] == local_1b8[0xb]);
        auVar14[0xc] = -(aes_test_cbc_enc[uVar10][0xc] == local_1b8[0xc]);
        auVar14[0xd] = -(aes_test_cbc_enc[uVar10][0xd] == local_1b8[0xd]);
        auVar14[0xe] = -(aes_test_cbc_enc[uVar10][0xe] == local_1b8[0xe]);
        auVar14[0xf] = -(aes_test_cbc_enc[uVar10][0xf] == local_1b8[0xf]);
        local_1b8 = auVar13;
      }
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015246a;
      if (verbose == 0) break;
      puts("passed");
      uVar9 = uVar9 + 1;
      if (uVar9 == 6) {
        putchar(10);
        goto LAB_00152100;
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
LAB_00152100:
  uVar9 = 0;
  do {
    while( true ) {
      uVar10 = uVar9 >> 1;
      uVar11 = uVar10 * 0x40 + 0x80;
      if (verbose != 0) {
        pcVar6 = "enc";
        if ((uVar9 & 1) == 0) {
          pcVar6 = "dec";
        }
        printf("  AES-CFB128-%3d (%s): ",(ulong)uVar11,pcVar6);
      }
      local_218[8] = '\b';
      local_218[9] = '\t';
      local_218[10] = '\n';
      local_218[0xb] = '\v';
      local_218[0xc] = '\f';
      local_218[0xd] = '\r';
      local_218[0xe] = '\x0e';
      local_218[0xf] = '\x0f';
      local_218[0] = '\0';
      local_218[1] = '\x01';
      local_218[2] = '\x02';
      local_218[3] = '\x03';
      local_218[4] = '\x04';
      local_218[5] = '\x05';
      local_218[6] = '\x06';
      local_218[7] = '\a';
      memcpy(local_1a8,aes_test_cfb128_key + uVar10,(ulong)(uVar10 * 8 + 0x10));
      mbedtls_aes_setkey_enc(&local_168,local_1a8,uVar11);
      if ((uVar9 & 1) == 0) {
        local_1f8._32_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x30);
        local_1f8._40_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x38);
        local_1f8._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x20);
        local_1f8._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x28);
        local_1f8._0_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x10);
        local_1f8._8_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x18);
        local_208 = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar10];
        lVar12 = 0;
        uVar8 = 0;
        do {
          if (uVar8 == 0) {
            mbedtls_aes_crypt_ecb(&local_168,1,local_218,local_218);
          }
          bVar1 = local_208[lVar12];
          local_208[lVar12] = local_218[uVar8] ^ bVar1;
          local_218[uVar8] = bVar1;
          uVar8 = (ulong)((int)uVar8 + 1U & 0xf);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x40);
        __s2 = aes_test_cfb128_pt;
      }
      else {
        local_1f8[0x20] = 0xf6;
        local_1f8[0x21] = 0x9f;
        local_1f8[0x22] = '$';
        local_1f8[0x23] = 'E';
        local_1f8[0x24] = 0xdf;
        local_1f8[0x25] = 'O';
        local_1f8[0x26] = 0x9b;
        local_1f8[0x27] = '\x17';
        local_1f8[0x28] = 0xad;
        local_1f8[0x29] = '+';
        local_1f8[0x2a] = 'A';
        local_1f8[0x2b] = '{';
        local_1f8[0x2c] = 0xe6;
        local_1f8[0x2d] = 'l';
        local_1f8[0x2e] = '7';
        local_1f8[0x2f] = '\x10';
        local_1f8[0x10] = '0';
        local_1f8[0x11] = 200;
        local_1f8[0x12] = '\x1c';
        local_1f8[0x13] = 'F';
        local_1f8[0x14] = 0xa3;
        local_1f8[0x15] = '\\';
        local_1f8[0x16] = 0xe4;
        local_1f8[0x17] = '\x11';
        local_1f8[0x18] = 0xe5;
        local_1f8[0x19] = 0xfb;
        local_1f8[0x1a] = 0xc1;
        local_1f8[0x1b] = '\x19';
        local_1f8[0x1c] = '\x1a';
        local_1f8[0x1d] = '\n';
        local_1f8[0x1e] = 'R';
        local_1f8[0x1f] = 0xef;
        local_1f8[0] = 0xae;
        local_1f8[1] = '-';
        local_1f8[2] = 0x8a;
        local_1f8[3] = 'W';
        local_1f8[4] = '\x1e';
        local_1f8[5] = '\x03';
        local_1f8[6] = 0xac;
        local_1f8[7] = 0x9c;
        local_1f8[8] = 0x9e;
        local_1f8[9] = 0xb7;
        local_1f8[10] = 'o';
        local_1f8[0xb] = 0xac;
        local_1f8[0xc] = 'E';
        local_1f8[0xd] = 0xaf;
        local_1f8[0xe] = 0x8e;
        local_1f8[0xf] = 'Q';
        local_208[8] = 0xe9;
        local_208[9] = '=';
        local_208[10] = '~';
        local_208[0xb] = '\x11';
        local_208[0xc] = 's';
        local_208[0xd] = 0x93;
        local_208[0xe] = '\x17';
        local_208[0xf] = '*';
        local_208[0] = 'k';
        local_208[1] = 0xc1;
        local_208[2] = 0xbe;
        local_208[3] = 0xe2;
        local_208[4] = '.';
        local_208[5] = '@';
        local_208[6] = 0x9f;
        local_208[7] = 0x96;
        lVar12 = 0;
        uVar8 = 0;
        do {
          if (uVar8 == 0) {
            mbedtls_aes_crypt_ecb(&local_168,1,local_218,local_218);
          }
          bVar1 = local_208[lVar12];
          bVar2 = local_218[uVar8];
          local_208[lVar12] = bVar1 ^ bVar2;
          local_218[uVar8] = bVar1 ^ bVar2;
          uVar8 = (ulong)((int)uVar8 + 1U & 0xf);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x40);
        __s2 = aes_test_cfb128_ct[uVar10];
      }
      iVar7 = bcmp(local_208,__s2,0x40);
      if (iVar7 != 0) goto LAB_0015246a;
      if (verbose == 0) break;
      puts("passed");
      uVar9 = uVar9 + 1;
      if (uVar9 == 6) {
        putchar(10);
        goto LAB_001522f8;
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
LAB_001522f8:
  uVar8 = 0;
  do {
    while( true ) {
      if (verbose != 0) {
        pcVar6 = "enc";
        if ((uVar8 & 1) == 0) {
          pcVar6 = "dec";
        }
        printf("  AES-CTR-128 (%s): ",pcVar6);
      }
      uVar3 = uVar8 >> 1;
      local_188 = *(undefined8 *)aes_test_ctr_nonce_counter[uVar3];
      uStack_180 = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar3] + 8);
      local_1a8 = aes_test_ctr_key[uVar3];
      local_1c0 = 0;
      mbedtls_aes_setkey_enc(&local_168,local_1a8,0x80);
      __n = (size_t)aes_test_ctr_len[uVar3];
      if ((uVar8 & 1) == 0) {
        memcpy(local_208,aes_test_ctr_ct + uVar3,__n);
        mbedtls_aes_crypt_ctr
                  (&local_168,__n,&local_1c0,(uchar *)&local_188,local_178,local_208,local_208);
        pauVar5 = aes_test_ctr_pt;
      }
      else {
        memcpy(local_208,aes_test_ctr_pt + uVar3,__n);
        mbedtls_aes_crypt_ctr
                  (&local_168,__n,&local_1c0,(uchar *)&local_188,local_178,local_208,local_208);
        pauVar5 = aes_test_ctr_ct;
      }
      iVar7 = bcmp(local_208,pauVar5 + uVar3,__n);
      if (iVar7 != 0) goto LAB_0015246a;
      if (verbose == 0) break;
      puts("passed");
      uVar9 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar9;
      if (uVar9 == 6) {
        putchar(10);
        goto LAB_001524b5;
      }
    }
    uVar9 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar9;
  } while (uVar9 != 6);
LAB_001524b5:
  iVar7 = 0;
LAB_00152482:
  lVar12 = 0;
  do {
    *(undefined1 *)((long)local_168.buf + lVar12 + -0x10) = 0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x120);
  return iVar7;
LAB_0015246a:
  iVar7 = 1;
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_00152482;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, v;
    unsigned char key[32];
    unsigned char buf[64];
    unsigned char iv[16];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    int len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            mbedtls_aes_setkey_dec( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_ecb( &ctx, v, buf, buf );

            if( memcmp( buf, aes_test_ecb_dec[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_ecb( &ctx, v, buf, buf );

            if( memcmp( buf, aes_test_ecb_enc[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            mbedtls_aes_setkey_dec( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_cbc( &ctx, v, 16, iv, buf, buf );

            if( memcmp( buf, aes_test_cbc_dec[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
            {
                unsigned char tmp[16];

                mbedtls_aes_crypt_cbc( &ctx, v, 16, iv, buf, buf );

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            if( memcmp( prv, aes_test_cbc_enc[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], 16 + u * 8 );

        offset = 0;
        mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            mbedtls_aes_crypt_cfb128( &ctx, v, 64, &offset, iv, buf, buf );

            if( memcmp( buf, aes_test_cfb128_pt, 64 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            mbedtls_aes_crypt_cfb128( &ctx, v, 64, &offset, iv, buf, buf );

            if( memcmp( buf, aes_test_cfb128_ct[u], 64 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        mbedtls_aes_setkey_enc( &ctx, key, 128 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            len = aes_test_ctr_len[u];
            memcpy( buf, aes_test_ctr_ct[u], len );

            mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                           buf, buf );

            if( memcmp( buf, aes_test_ctr_pt[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            len = aes_test_ctr_len[u];
            memcpy( buf, aes_test_ctr_pt[u], len );

            mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                           buf, buf );

            if( memcmp( buf, aes_test_ctr_ct[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    ret = 0;

exit:
    mbedtls_aes_free( &ctx );

    return( ret );
}